

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_biquad_init_preallocated(ma_biquad_config *pConfig,void *pHeap,ma_biquad *pBQ)

{
  void *in_RDX;
  void *in_RSI;
  ma_biquad_heap_layout heapLayout;
  ma_result result;
  ma_biquad_config *in_stack_ffffffffffffff98;
  size_t local_60;
  long local_58;
  long local_50;
  ma_result local_24;
  
  if (in_RDX == (void *)0x0) {
    local_24 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,0x40);
    }
    local_24 = ma_biquad_get_heap_layout
                         (in_stack_ffffffffffffff98,(ma_biquad_heap_layout *)0x1bd0ed);
    if (local_24 == MA_SUCCESS) {
      *(void **)((long)in_RDX + 0x30) = in_RSI;
      if ((in_RSI != (void *)0x0) && (local_60 != 0)) {
        memset(in_RSI,0,local_60);
      }
      *(long *)((long)in_RDX + 0x20) = (long)in_RSI + local_58;
      *(long *)((long)in_RDX + 0x28) = (long)in_RSI + local_50;
      local_24 = ma_biquad_reinit(in_stack_ffffffffffffff98,(ma_biquad *)0x1bd17c);
    }
  }
  return local_24;
}

Assistant:

MA_API ma_result ma_biquad_init_preallocated(const ma_biquad_config* pConfig, void* pHeap, ma_biquad* pBQ)
{
    ma_result result;
    ma_biquad_heap_layout heapLayout;

    if (pBQ == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pBQ);

    result = ma_biquad_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pBQ->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pBQ->pR1 = (ma_biquad_coefficient*)ma_offset_ptr(pHeap, heapLayout.r1Offset);
    pBQ->pR2 = (ma_biquad_coefficient*)ma_offset_ptr(pHeap, heapLayout.r2Offset);

    return ma_biquad_reinit(pConfig, pBQ);
}